

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CTYPECommand::doWhat(CTYPECommand *this,CClient *pClient)

{
  int iVar1;
  bool bVar2;
  EFTPSTATE EVar3;
  string *__lhs;
  allocator local_31;
  string ret;
  
  EVar3 = CClient::GetClientState(pClient);
  if ((int)EVar3 < 3) {
    std::__cxx11::string::string
              ((string *)&ret,"530 Please login with USER and PASS.\r\n",&local_31);
    CClient::sendMsg(pClient,&ret);
LAB_00107f39:
    std::__cxx11::string::~string((string *)&ret);
    iVar1 = -1;
  }
  else {
    __lhs = &(this->super_CCommand).m_Args;
    bVar2 = std::operator==(__lhs,"I");
    if (bVar2) {
      std::__cxx11::string::string((string *)&ret,"200 Switching to Binary mode.\r\n",&local_31);
      CClient::sendMsg(pClient,&ret);
    }
    else {
      bVar2 = std::operator==(__lhs,"A");
      if (!bVar2) {
        std::__cxx11::string::string((string *)&ret,"500 Unrecognised TYPE command.\r\n",&local_31);
        CClient::sendMsg(pClient,&ret);
        goto LAB_00107f39;
      }
      std::__cxx11::string::string((string *)&ret,"200 Switching to ASCII mode.\r\n",&local_31);
      CClient::sendMsg(pClient,&ret);
    }
    std::__cxx11::string::~string((string *)&ret);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CTYPECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        if(m_Args == "I"){
            string ret = "200 Switching to Binary mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else if(m_Args == "A"){
            string ret = "200 Switching to ASCII mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        // there should have some orther type mode.
        else{
            string ret = "500 Unrecognised TYPE command.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}